

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cClipControlTests.cpp
# Opt level: O0

IterateResult __thiscall gl4cts::ClipControlErrors::iterate(ClipControlErrors *this)

{
  TestContext *pTVar1;
  int iVar2;
  TestLog *this_00;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  char *pcVar4;
  MessageBuilder *pMVar5;
  bool bVar6;
  MessageBuilder local_1f0;
  ulong local_70;
  size_t i;
  GLenum cases [5] [2];
  GLenum local_34;
  undefined1 auStack_30 [4];
  GLenum improper_value;
  ClipControlApi cc;
  Functions *gl;
  TestLog *log;
  ClipControlErrors *this_local;
  
  this_00 = tcu::TestContext::getLog
                      ((this->super_ClipControlBaseTest).super_TestCase.super_TestCase.
                       super_TestNode.m_testCtx);
  pRVar3 = deqp::Context::getRenderContext
                     ((this->super_ClipControlBaseTest).super_TestCase.m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  cc.m_context = (Context *)CONCAT44(extraout_var,iVar2);
  ClipControlApi::ClipControlApi
            ((ClipControlApi *)auStack_30,(this->super_ClipControlBaseTest).super_TestCase.m_context
             ,(this->super_ClipControlBaseTest).m_api);
  local_34 = 0;
  while( true ) {
    bVar6 = true;
    if (((local_34 != 0x8ca2) && (bVar6 = true, local_34 != 0x8ca1)) &&
       (bVar6 = true, local_34 != 0x935f)) {
      bVar6 = local_34 == 0x935e;
    }
    if (!bVar6) break;
    local_34 = local_34 + 1;
  }
  i._0_4_ = 0x8ca2;
  i._4_4_ = local_34;
  cases[0][0] = 0x8ca1;
  cases[0][1] = local_34;
  cases[1][0] = local_34;
  cases[1][1] = 0x935f;
  cases[2][0] = local_34;
  cases[2][1] = 0x935e;
  cases[3][0] = local_34;
  cases[3][1] = local_34;
  for (local_70 = 0; local_70 < 5; local_70 = local_70 + 1) {
    (*_auStack_30)(cases[local_70 - 1][0],cases[local_70 - 1][1]);
    iVar2 = (*(code *)cc.m_context[0x40].m_testCtx)();
    if (iVar2 != 0x500) {
      pTVar1 = (this->super_ClipControlBaseTest).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx;
      pcVar4 = qpGetTestResultName(QP_TEST_RESULT_FAIL);
      tcu::TestContext::setTestResult(pTVar1,QP_TEST_RESULT_FAIL,pcVar4);
      tcu::TestLog::operator<<(&local_1f0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar5 = tcu::MessageBuilder::operator<<
                         (&local_1f0,
                          (char (*) [86])
                          "ClipControl have not generated GL_INVALID_ENUM error when called with invalid value ("
                         );
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,cases[local_70 - 1]);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2a3caab);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,cases[local_70 - 1] + 1);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2c156ab);
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1f0);
    }
  }
  pTVar1 = (this->super_ClipControlBaseTest).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
  pcVar4 = qpGetTestResultName(QP_TEST_RESULT_PASS);
  tcu::TestContext::setTestResult(pTVar1,QP_TEST_RESULT_PASS,pcVar4);
  return STOP;
}

Assistant:

IterateResult iterate()
	{
		/* API query */
		tcu::TestLog&		  log = m_testCtx.getLog();
		const glw::Functions& gl  = m_context.getRenderContext().getFunctions();
		ClipControlApi		  cc(m_context, m_api);

		/* Finding improper value. */
		GLenum improper_value = GL_NONE;

		while ((GL_UPPER_LEFT == improper_value) || (GL_LOWER_LEFT == improper_value) ||
			   (GL_ZERO_TO_ONE == improper_value) || (GL_NEGATIVE_ONE_TO_ONE == improper_value))
		{
			++improper_value;
		}

		/* Test setup. */
		GLenum cases[5][2] = { { GL_UPPER_LEFT, improper_value },
							   { GL_LOWER_LEFT, improper_value },
							   { improper_value, GL_ZERO_TO_ONE },
							   { improper_value, GL_NEGATIVE_ONE_TO_ONE },
							   { improper_value, improper_value } };

		/* Test iterations. */
		for (size_t i = 0; i < DE_LENGTH_OF_ARRAY(cases); i++)
		{
			cc.clipControl(cases[i][0], cases[i][1]);

			if (GL_INVALID_ENUM != gl.getError())
			{
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, qpGetTestResultName(QP_TEST_RESULT_FAIL));

				log << tcu::TestLog::Message
					<< "ClipControl have not generated GL_INVALID_ENUM error when called with invalid value ("
					<< cases[i][0] << ", " << cases[i][1] << ")." << tcu::TestLog::EndMessage;
			}
		}

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, qpGetTestResultName(QP_TEST_RESULT_PASS));
		return STOP;
	}